

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

ClassDescription * __thiscall Lodtalk::ClassTable::getClassFromIndex(ClassTable *this,size_t index)

{
  ulong uVar1;
  reference ppOVar2;
  size_t elementIndex;
  size_t pageIndex;
  ReadLock<Lodtalk::SharedMutex> local_28;
  ReadLock<Lodtalk::SharedMutex> l;
  size_t index_local;
  ClassTable *this_local;
  
  l.mutex = (SharedMutex *)index;
  ReadLock<Lodtalk::SharedMutex>::ReadLock(&local_28,&this->sharedMutex);
  if (l.mutex < (SharedMutex *)this->size) {
    uVar1 = (ulong)l.mutex & 0x1ff;
    ppOVar2 = std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>::operator[]
                        (&this->pageTable,(ulong)l.mutex >> 9);
    this_local = (ClassTable *)(*ppOVar2)[uVar1].field_0.header;
  }
  else {
    this_local = (ClassTable *)&NilObject;
  }
  ReadLock<Lodtalk::SharedMutex>::~ReadLock(&local_28);
  return (ClassDescription *)this_local;
}

Assistant:

ClassDescription *ClassTable::getClassFromIndex(size_t index)
{
    ReadLock<SharedMutex> l(sharedMutex);
    if(index >= size)
        return reinterpret_cast<ClassDescription*> (&NilObject);

    auto pageIndex = index / OopsPerPage;
    auto elementIndex = index % OopsPerPage;
    return reinterpret_cast<ClassDescription*> (pageTable[pageIndex][elementIndex].pointer);
}